

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Bias_x86_avx512::forward_inplace(Bias_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  long *in_RSI;
  long in_RDI;
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _bias;
  __m256 _outp;
  __m256 _p;
  __m256 _bias256;
  int i;
  float bias;
  float *ptr;
  int q;
  float *bias_ptr;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  int local_2d4;
  float *local_278;
  int local_26c;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  
  lVar5 = in_RSI[7];
  iVar6 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
  lVar2 = *(long *)(in_RDI + 0xd8);
  for (local_26c = 0; local_26c < (int)lVar5; local_26c = local_26c + 1) {
    local_278 = (float *)(*in_RSI + in_RSI[8] * (long)local_26c * in_RSI[2]);
    fVar1 = *(float *)(lVar2 + (long)local_26c * 4);
    local_2d4 = 0;
    auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
    auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
    for (; local_2d4 + 7 < iVar6; local_2d4 = local_2d4 + 8) {
      local_1c0 = (float)*(undefined8 *)local_278;
      fStack_1bc = (float)((ulong)*(undefined8 *)local_278 >> 0x20);
      fStack_1b8 = (float)*(undefined8 *)(local_278 + 2);
      fStack_1b4 = (float)((ulong)*(undefined8 *)(local_278 + 2) >> 0x20);
      fStack_1b0 = (float)*(undefined8 *)(local_278 + 4);
      fStack_1ac = (float)((ulong)*(undefined8 *)(local_278 + 4) >> 0x20);
      fStack_1a8 = (float)*(undefined8 *)(local_278 + 6);
      fStack_1a4 = (float)((ulong)*(undefined8 *)(local_278 + 6) >> 0x20);
      local_1e0 = auVar4._0_4_;
      fStack_1dc = auVar4._4_4_;
      fStack_1d8 = auVar4._8_4_;
      fStack_1d4 = auVar4._12_4_;
      fStack_1d0 = auVar3._0_4_;
      fStack_1cc = auVar3._4_4_;
      fStack_1c8 = auVar3._8_4_;
      fStack_1c4 = auVar3._12_4_;
      *(ulong *)local_278 = CONCAT44(fStack_1bc + fStack_1dc,local_1c0 + local_1e0);
      *(ulong *)(local_278 + 2) = CONCAT44(fStack_1b4 + fStack_1d4,fStack_1b8 + fStack_1d8);
      *(ulong *)(local_278 + 4) = CONCAT44(fStack_1ac + fStack_1cc,fStack_1b0 + fStack_1d0);
      *(ulong *)(local_278 + 6) = CONCAT44(fStack_1a4 + fStack_1c4,fStack_1a8 + fStack_1c8);
      local_278 = local_278 + 8;
    }
    for (; local_2d4 + 3 < iVar6; local_2d4 = local_2d4 + 4) {
      local_140 = (float)*(undefined8 *)local_278;
      fStack_13c = (float)((ulong)*(undefined8 *)local_278 >> 0x20);
      fStack_138 = (float)*(undefined8 *)(local_278 + 2);
      fStack_134 = (float)((ulong)*(undefined8 *)(local_278 + 2) >> 0x20);
      *(ulong *)local_278 = CONCAT44(fStack_13c + fVar1,local_140 + fVar1);
      *(ulong *)(local_278 + 2) = CONCAT44(fStack_134 + fVar1,fStack_138 + fVar1);
      local_278 = local_278 + 4;
    }
    for (; local_2d4 < iVar6; local_2d4 = local_2d4 + 1) {
      *local_278 = *local_278 + fVar1;
      local_278 = local_278 + 1;
    }
  }
  return 0;
}

Assistant:

int Bias_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}